

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_check_text(nk_context *ctx,char *text,int len,int active)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_input *local_68;
  undefined1 auStack_58 [4];
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  int active_local;
  int len_local;
  char *text_local;
  nk_context *ctx_local;
  
  win._0_4_ = active;
  win._4_4_ = len;
  _active_local = text;
  text_local = (char *)ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4f54,"int nk_check_text(struct nk_context *, const char *, int, int)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4f55,"int nk_check_text(struct nk_context *, const char *, int, int)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4f56,"int nk_check_text(struct nk_context *, const char *, int, int)");
  }
  ctx_local._4_4_ = active;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current;
    bounds._8_8_ = &ctx->style;
    pnVar2 = pnVar1->layout;
    nVar3 = nk_widget((nk_rect *)auStack_58,ctx);
    if (nVar3 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = (int)win;
    }
    else {
      if ((nVar3 == NK_WIDGET_ROM) || ((pnVar2->flags & 0x1000) != 0)) {
        local_68 = (nk_input *)0x0;
      }
      else {
        local_68 = (nk_input *)text_local;
      }
      nk_do_toggle((nk_flags *)(text_local + 0x1f70),&pnVar1->buffer,_auStack_58,(int *)&win,
                   _active_local,win._4_4_,NK_TOGGLE_CHECK,(nk_style_toggle *)(bounds._8_8_ + 0x360)
                   ,local_68,*(nk_user_font **)bounds._8_8_);
      ctx_local._4_4_ = (int)win;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_check_text(struct nk_context *ctx, const char *text, int len, int active)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return active;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return active;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_toggle(&ctx->last_widget_state, &win->buffer, bounds, &active,
        text, len, NK_TOGGLE_CHECK, &style->checkbox, in, style->font);
    return active;
}